

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

uint64_t fdb_kvs_header_append(fdb_kvs_handle *handle)

{
  docio_handle *handle_00;
  kvs_header *pkVar1;
  filemgr_magic_t magic;
  avl_node *paVar2;
  bid_t offset;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  fdb_status fVar6;
  avl_node *paVar7;
  size_t sVar8;
  ulong *__ptr;
  bid_t bVar9;
  uint32_t uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  docio_length doc_len;
  char local_88 [32];
  docio_object local_68;
  
  doc_len.keylen = 0;
  doc_len.metalen = 0;
  doc_len.bodylen = 0;
  doc_len.bodylen_ondisk = 0;
  doc_len.flag = '\0';
  doc_len.checksum = '\0';
  doc_len.reserved = 0;
  handle_00 = handle->dhandle;
  pkVar1 = handle->file->kv_header;
  if (pkVar1 == (kvs_header *)0x0) {
    __ptr = (ulong *)0x0;
    uVar10 = 0;
  }
  else {
    magic = handle->file->version;
    pthread_spin_lock(&pkVar1->lock);
    paVar7 = avl_first(pkVar1->idx_name);
    uVar10 = 0x10;
    uVar12 = 0;
    for (; paVar7 != (avl_node *)0x0; paVar7 = avl_next(paVar7)) {
      uVar12 = uVar12 + 1;
      sVar8 = strlen((char *)paVar7[-7].left);
      bVar3 = ver_is_atleast_magic_001(magic);
      uVar10 = uVar10 + (int)sVar8 + (uint)bVar3 * 0x10 + 0x33;
    }
    __ptr = (ulong *)malloc((long)(int)uVar10);
    *__ptr = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
             uVar12 << 0x38;
    uVar12 = pkVar1->id_counter;
    __ptr[1] = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
               (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
               (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28
               | uVar12 << 0x38;
    paVar7 = avl_first(pkVar1->idx_name);
    lVar13 = 0x10;
    for (; paVar7 != (avl_node *)0x0; paVar7 = avl_next(paVar7)) {
      paVar2 = paVar7[-7].left;
      sVar8 = strlen((char *)paVar2);
      uVar5 = (int)sVar8 + 1;
      uVar14 = uVar5 & 0xffff;
      uVar4 = (ushort)uVar5;
      iVar11 = (int)lVar13;
      *(ushort *)((long)__ptr + (long)iVar11) = uVar4 << 8 | uVar4 >> 8;
      memcpy((void *)((long)(iVar11 + 2) + (long)__ptr),paVar2,(ulong)uVar14);
      paVar2 = paVar7[-7].right;
      *(ulong *)((long)__ptr + (long)(int)(iVar11 + uVar14 + 2)) =
           (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
           ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
           ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
           ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
      paVar2 = paVar7[-6].parent;
      *(ulong *)((long)__ptr + (long)(int)(iVar11 + 10 + uVar14)) =
           (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
           ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
           ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
           ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
      paVar2 = paVar7[-3].right;
      *(ulong *)((long)__ptr + (long)(int)(iVar11 + 0x12 + uVar14)) =
           (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
           ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
           ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
           ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
      paVar2 = paVar7[-2].parent;
      *(ulong *)((long)__ptr + (long)(int)(iVar11 + 0x1a + uVar14)) =
           (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
           ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
           ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
           ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
      paVar2 = paVar7[-2].right;
      *(ulong *)((long)__ptr + (long)(int)(iVar11 + 0x22 + uVar14)) =
           (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
           ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
           ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
           ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
      paVar2 = paVar7[-6].left;
      lVar13 = (long)(int)(iVar11 + uVar14 + 0x2a);
      *(ulong *)((long)__ptr + lVar13) =
           (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
           ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
           ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
           ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
      lVar13 = lVar13 + 8;
      bVar3 = ver_is_atleast_magic_001(magic);
      if (bVar3) {
        paVar2 = paVar7[-1].right;
        *(ulong *)((long)__ptr + (long)(int)lVar13) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        paVar2 = paVar7[-2].left;
        lVar13 = (long)(int)(iVar11 + uVar14 + 0x3a);
        *(ulong *)((long)__ptr + lVar13) =
             (ulong)paVar2 >> 0x38 | ((ulong)paVar2 & 0xff000000000000) >> 0x28 |
             ((ulong)paVar2 & 0xff0000000000) >> 0x18 | ((ulong)paVar2 & 0xff00000000) >> 8 |
             ((ulong)paVar2 & 0xff000000) << 8 | ((ulong)paVar2 & 0xff0000) << 0x18 |
             ((ulong)paVar2 & 0xff00) << 0x28 | (long)paVar2 << 0x38;
        lVar13 = lVar13 + 8;
      }
    }
    pthread_spin_unlock(&pkVar1->lock);
  }
  offset = handle->kv_info_offset;
  local_68.length.bodylen_ondisk = 0;
  local_68.length.flag = '\0';
  local_68.length.checksum = '\0';
  local_68.length.reserved = 0;
  local_68.timestamp = 0;
  local_68._20_4_ = 0;
  local_68.key = local_88;
  builtin_strncpy(local_88,"KV_header",10);
  local_68.meta = (void *)0x0;
  local_68.body = __ptr;
  sVar8 = strlen((char *)local_68.key);
  local_68.length.keylen = (short)sVar8 + 1;
  local_68.length.metalen = 0;
  local_68.field_3.seqnum = 0;
  local_68.length.bodylen = uVar10;
  bVar9 = docio_append_doc_system(handle_00,&local_68);
  free(__ptr);
  if (offset != 0xffffffffffffffff) {
    fVar6 = docio_read_doc_length(handle->dhandle,&doc_len,offset);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      filemgr_mark_stale(handle->file,offset,
                         (ulong)((doc_len._0_4_ & 0xffff) + ((uint)doc_len._0_4_ >> 0x10) +
                                doc_len.bodylen_ondisk) + 0x20);
    }
  }
  return bVar9;
}

Assistant:

uint64_t fdb_kvs_header_append(fdb_kvs_handle *handle)
{
    char *doc_key = alca(char, 32);
    void *data;
    size_t len;
    uint64_t kv_info_offset, prev_offset;
    struct docio_object doc;
    struct docio_length doc_len;
    struct filemgr *file = handle->file;
    struct docio_handle *dhandle = handle->dhandle;

    _fdb_kvs_header_export(file->kv_header, &data, &len, file->version);

    prev_offset = handle->kv_info_offset;

    memset(&doc, 0, sizeof(struct docio_object));
    sprintf(doc_key, "KV_header");
    doc.key = (void *)doc_key;
    doc.meta = NULL;
    doc.body = data;
    doc.length.keylen = strlen(doc_key) + 1;
    doc.length.metalen = 0;
    doc.length.bodylen = len;
    doc.seqnum = 0;
    kv_info_offset = docio_append_doc_system(dhandle, &doc);
    free(data);

    if (prev_offset != BLK_NOT_FOUND) {
        if (docio_read_doc_length(handle->dhandle, &doc_len, prev_offset)
            == FDB_RESULT_SUCCESS) {
            // mark stale
            filemgr_mark_stale(handle->file, prev_offset, _fdb_get_docsize(doc_len));
        }
    }

    return kv_info_offset;
}